

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

void __thiscall ecjacobian::mul2(ecjacobian *this)

{
  gfield *y;
  bigint<13> *pbVar1;
  gfield *x;
  gfield *pgVar2;
  long lVar3;
  ecjacobian *peVar4;
  bigint<26> result;
  gfield c;
  gfield d;
  gfield b;
  gfield a;
  bigint<26> local_e8;
  bigint<13> local_b0;
  bigint<13> local_90;
  bigint<13> local_70;
  bigint<13> local_50;
  
  if ((this->z).super_gfint.len != 0) {
    if ((this->y).super_gfint.len == 0) {
      peVar4 = &origin;
      for (lVar3 = 0x18; lVar3 != 0; lVar3 = lVar3 + -1) {
        (this->x).super_gfint.len = (peVar4->x).super_gfint.len;
        peVar4 = (ecjacobian *)(peVar4->x).super_gfint.digits;
        this = (ecjacobian *)(this->x).super_gfint.digits;
      }
    }
    else {
      pgVar2 = &this->z;
      y = &this->y;
      bigint<26>::mul<13,13>(&local_e8,&pgVar2->super_gfint,&pgVar2->super_gfint);
      gfield::reduce<26>((gfield *)&local_b0,&local_e8);
      gfield::sub<13,13>((gfield *)&local_90,(bigint<13> *)this,&local_b0);
      pbVar1 = &gfield::add<13,13>((gfield *)&local_b0,&local_b0,(bigint<13> *)this)->super_gfint;
      bigint<26>::mul<13,13>(&local_e8,&local_90,pbVar1);
      gfield::reduce<26>((gfield *)&local_90,&local_e8);
      x = gfield::add<13,13>((gfield *)&local_b0,&local_90,&local_90);
      gfield::add<13,13>(x,&x->super_gfint,&local_90);
      bigint<26>::mul<13,13>(&local_e8,&pgVar2->super_gfint,&y->super_gfint);
      gfield::reduce<26>(pgVar2,&local_e8);
      gfield::add<13,13>(pgVar2,&pgVar2->super_gfint,&pgVar2->super_gfint);
      bigint<26>::mul<13,13>(&local_e8,&y->super_gfint,&y->super_gfint);
      gfield::reduce<26>((gfield *)&local_50,&local_e8);
      gfield::add<13,13>((gfield *)&local_70,&local_50,&local_50);
      pbVar1 = &gfield::add<13,13>((gfield *)&local_90,(bigint<13> *)this,(bigint<13> *)this)->
                super_gfint;
      bigint<26>::mul<13,13>(&local_e8,pbVar1,&local_70);
      gfield::reduce<26>((gfield *)pbVar1,&local_e8);
      bigint<26>::mul<13,13>(&local_e8,&local_b0,&local_b0);
      gfield::reduce<26>(&this->x,&local_e8);
      pgVar2 = gfield::sub<13,13>(&this->x,(bigint<13> *)this,&local_90);
      gfield::sub<13,13>(pgVar2,&pgVar2->super_gfint,&local_90);
      bigint<26>::mul<13,13>(&local_e8,&local_70,&local_70);
      gfield::reduce<26>((gfield *)&local_50,&local_e8);
      gfield::add<13,13>((gfield *)&local_50,&local_50,&local_50);
      pbVar1 = &gfield::sub<13,13>(y,&local_90,(bigint<13> *)this)->super_gfint;
      bigint<26>::mul<13,13>(&local_e8,pbVar1,&local_b0);
      gfield::reduce<26>((gfield *)pbVar1,&local_e8);
      gfield::sub<13,13>((gfield *)pbVar1,pbVar1,&local_50);
    }
  }
  return;
}

Assistant:

bool iszero() const { return !len; }